

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O3

Value * __thiscall
ot::commissioner::Interpreter::ProcessBbrDatasetJob
          (Value *__return_storage_ptr__,Interpreter *this,CommissionerAppPtr *aCommissioner,
          Expression *aExpr)

{
  ErrorCode EVar1;
  element_type *peVar2;
  char cVar3;
  undefined1 auVar4 [8];
  int iVar5;
  ulong uVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  char *pcVar8;
  Value *pVVar9;
  pointer pcVar10;
  BbrDataset *extraout_RDX;
  BbrDataset *extraout_RDX_00;
  BbrDataset *extraout_RDX_01;
  BbrDataset *extraout_RDX_02;
  BbrDataset *aDataset;
  char *pcVar11;
  undefined1 *puVar12;
  _Alloc_hider _Var13;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  pointer pbVar14;
  string *aStr;
  undefined7 uVar16;
  ulong uVar15;
  undefined1 *puVar17;
  bool bVar18;
  string_view fmt;
  string_view fmt_00;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  format_args args_03;
  format_args args_04;
  format_args args_05;
  string triHostname;
  BbrDataset dataset;
  string local_408;
  undefined1 local_3e8 [8];
  _Alloc_hider _Stack_3e0;
  undefined1 local_3d8 [24];
  _Alloc_hider local_3c0;
  size_type local_3b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3b0;
  undefined1 local_3a0 [8];
  _Alloc_hider local_398;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_390;
  undefined8 local_380;
  _Alloc_hider local_378;
  undefined1 local_370 [24];
  size_type local_358;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_350;
  uint16_t local_340;
  CommissionerAppPtr *local_338;
  string *local_330;
  string *local_328;
  uint local_31c;
  undefined1 local_318 [16];
  undefined4 local_308;
  undefined1 *local_300;
  long local_2f8;
  undefined1 local_2f0 [16];
  undefined4 local_2e0;
  undefined1 *local_2d8;
  long local_2d0;
  undefined1 local_2c8 [16];
  undefined4 local_2b8;
  undefined1 *local_2b0;
  long local_2a8;
  undefined1 local_2a0 [16];
  undefined4 local_290;
  undefined1 *local_288;
  long local_280;
  undefined1 local_278 [16];
  undefined4 local_268;
  undefined1 *local_260;
  long local_258;
  undefined1 local_250 [16];
  undefined4 local_240;
  undefined1 *local_238;
  long local_230;
  undefined1 local_228 [16];
  undefined4 local_218;
  undefined1 *local_210;
  long local_208;
  undefined1 local_200 [16];
  string local_1f0;
  string local_1d0;
  string local_1b0;
  type local_190 [2] [1];
  undefined1 *local_188;
  long local_180;
  undefined1 local_178 [16];
  Error local_168;
  undefined4 local_140 [2];
  undefined1 *local_138;
  long local_130;
  undefined1 local_128 [16];
  undefined4 local_118 [2];
  undefined1 *local_110;
  long local_108;
  undefined1 local_100 [16];
  undefined4 local_f0 [2];
  long local_e8;
  long local_e0;
  char local_d8 [16];
  undefined4 local_c8 [2];
  undefined1 *local_c0;
  long local_b8;
  undefined1 local_b0 [16];
  undefined4 local_a0 [2];
  long local_98;
  long local_90;
  char local_88 [16];
  undefined4 local_78 [2];
  undefined1 *local_70;
  long local_68;
  undefined1 local_60 [16];
  string local_50;
  
  (__return_storage_ptr__->mError).mCode = kNone;
  local_330 = (string *)&(__return_storage_ptr__->mError).mMessage;
  (__return_storage_ptr__->mError).mMessage._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mError).mMessage.field_2;
  (__return_storage_ptr__->mError).mMessage._M_string_length = 0;
  (__return_storage_ptr__->mError).mMessage.field_2._M_local_buf[0] = '\0';
  local_328 = (string *)&__return_storage_ptr__->mData;
  (__return_storage_ptr__->mData)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mData).field_2;
  (__return_storage_ptr__->mData)._M_string_length = 0;
  (__return_storage_ptr__->mData).field_2._M_local_buf[0] = '\0';
  pbVar14 = (aExpr->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(aExpr->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar14) < 0x21) {
    local_3e8 = (undefined1  [8])((ulong)local_3e8 & 0xffffffff00000000);
    _Stack_3e0._M_p = "too few arguments";
    local_3d8._0_8_ = 0x11;
    local_3d8._8_8_ = 0;
    local_3c0._M_p = (pointer)0x0;
    pcVar11 = "too few arguments";
    local_3d8._16_8_ = (format_string_checker<char> *)local_3e8;
    do {
      pcVar8 = pcVar11 + 1;
      if (*pcVar11 == '}') {
        if ((pcVar8 == "") || (*pcVar8 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar8 = pcVar11 + 2;
      }
      else if (*pcVar11 == '{') {
        pcVar8 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (pcVar11,"",(format_string_checker<char> *)local_3e8);
      }
      pcVar11 = pcVar8;
    } while (pcVar8 != "");
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)local_3e8;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_408,(v10 *)"too few arguments",(string_view)ZEXT816(0x11),args);
    local_218 = 2;
    local_210 = local_200;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_210,local_408._M_dataplus._M_p,
               local_408._M_dataplus._M_p + local_408._M_string_length);
    local_3a0._0_4_ = local_218;
    local_398._M_p = local_390._M_local_buf + 8;
    std::__cxx11::string::_M_construct<char*>((string *)&local_398,local_210,local_210 + local_208);
    local_370._0_8_ = 0;
    local_370[8] = '\0';
    (__return_storage_ptr__->mError).mCode = local_3a0._0_4_;
    local_378._M_p = local_370 + 8;
    std::__cxx11::string::operator=(local_330,(string *)&local_398);
    std::__cxx11::string::operator=(local_328,(string *)&local_378);
    if (local_378._M_p != local_370 + 8) {
      operator_delete(local_378._M_p);
    }
    if (local_398._M_p != local_390._M_local_buf + 8) {
      operator_delete(local_398._M_p);
    }
    if (local_210 != local_200) {
      operator_delete(local_210);
    }
    paVar7 = &local_408.field_2;
    _Var13._M_p = local_408._M_dataplus._M_p;
LAB_001c5bda:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var13._M_p == paVar7) {
      return __return_storage_ptr__;
    }
    goto LAB_001c6aa7;
  }
  paVar7 = &local_408.field_2;
  local_408._M_dataplus._M_p = (pointer)paVar7;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_408,"get","");
  aStr = pbVar14 + 1;
  utils::ToLower((string *)local_3a0,aStr);
  utils::ToLower((string *)local_3e8,&local_408);
  auVar4 = local_3e8;
  local_338 = aCommissioner;
  if (local_398._M_p == _Stack_3e0._M_p) {
    uVar16 = (undefined7)((ulong)aStr >> 8);
    if (local_398._M_p == (char *)0x0) {
      uVar15 = CONCAT71(uVar16,1);
    }
    else {
      iVar5 = bcmp((void *)local_3a0,(void *)local_3e8,(size_t)local_398._M_p);
      uVar15 = CONCAT71(uVar16,iVar5 == 0);
    }
  }
  else {
    uVar15 = 0;
  }
  if (auVar4 != (undefined1  [8])local_3d8) {
    operator_delete((void *)auVar4);
  }
  if (local_3a0 != (undefined1  [8])&local_390) {
    operator_delete((void *)local_3a0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_408._M_dataplus._M_p != paVar7) {
    operator_delete(local_408._M_dataplus._M_p);
  }
  if ((char)uVar15 == '\0') {
    pbVar14 = (aExpr->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    local_408._M_dataplus._M_p = (pointer)paVar7;
    local_31c = (uint)uVar15;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_408,"set","");
    utils::ToLower((string *)local_3a0,pbVar14 + 1);
    utils::ToLower((string *)local_3e8,&local_408);
    auVar4 = local_3e8;
    if (local_398._M_p == _Stack_3e0._M_p) {
      if (local_398._M_p == (char *)0x0) {
        bVar18 = true;
      }
      else {
        iVar5 = bcmp((void *)local_3a0,(void *)local_3e8,(size_t)local_398._M_p);
        bVar18 = iVar5 == 0;
      }
    }
    else {
      bVar18 = false;
    }
    if (auVar4 != (undefined1  [8])local_3d8) {
      operator_delete((void *)auVar4);
    }
    if (local_3a0 != (undefined1  [8])&local_390) {
      operator_delete((void *)local_3a0);
    }
    uVar15 = (ulong)local_31c;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_408._M_dataplus._M_p != &local_408.field_2) {
      operator_delete(local_408._M_dataplus._M_p);
    }
    if (bVar18) {
      pbVar14 = (aExpr->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      uVar6 = (long)(aExpr->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar14;
      goto LAB_001c5cc4;
    }
    local_3e8._0_4_ = 0xd;
    _Stack_3e0._M_p = "\'{}\' is not a valid sub-command";
    local_3d8._0_8_ = 0x1f;
    local_3d8._8_8_ = 0x100000000;
    local_3c0._M_p =
         (pointer)::fmt::v10::detail::
                  parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
    ;
    pcVar11 = "\'{}\' is not a valid sub-command";
    local_3d8._16_8_ = (format_string_checker<char> *)local_3e8;
    do {
      pcVar8 = pcVar11 + 1;
      if (*pcVar11 == '}') {
        if ((pcVar8 == "") || (*pcVar8 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar8 = pcVar11 + 2;
      }
      else if (*pcVar11 == '{') {
        pcVar8 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                           (pcVar11,"",(format_string_checker<char> *)local_3e8);
      }
      pcVar11 = pcVar8;
    } while (pcVar8 != "");
    pbVar14 = (aExpr->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    local_3e8 = (undefined1  [8])pbVar14[1]._M_dataplus._M_p;
    _Stack_3e0._M_p = (pointer)pbVar14[1]._M_string_length;
    fmt.size_ = 0xd;
    fmt.data_ = (char *)0x1f;
    args_01.field_1.args_ = in_R9.args_;
    args_01.desc_ = (unsigned_long_long)local_3e8;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_408,(v10 *)"\'{}\' is not a valid sub-command",fmt,args_01);
    local_240 = 3;
    puVar17 = local_228;
    local_238 = puVar17;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_238,local_408._M_dataplus._M_p,
               local_408._M_dataplus._M_p + local_408._M_string_length);
    local_3a0._0_4_ = local_240;
    local_398._M_p = local_390._M_local_buf + 8;
    std::__cxx11::string::_M_construct<char*>((string *)&local_398,local_238,local_238 + local_230);
    local_370._0_8_ = 0;
    local_370[8] = '\0';
    (__return_storage_ptr__->mError).mCode = local_3a0._0_4_;
    local_378._M_p = local_370 + 8;
    std::__cxx11::string::operator=(local_330,(string *)&local_398);
    std::__cxx11::string::operator=(local_328,(string *)&local_378);
    if (local_378._M_p != local_370 + 8) {
      operator_delete(local_378._M_p);
    }
    puVar12 = local_238;
    if (local_398._M_p != local_390._M_local_buf + 8) {
      operator_delete(local_398._M_p);
      puVar12 = local_238;
    }
  }
  else {
    pbVar14 = (aExpr->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    uVar6 = (long)(aExpr->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar14;
    if ((char)uVar15 == '\x01' && uVar6 == 0x40) {
      local_3a0 = (undefined1  [8])&local_390;
      local_398._M_p = (char *)0x0;
      local_390._M_local_buf[0] = '\0';
      local_378._M_p = (pointer)0x0;
      local_370._0_8_ = local_370._0_8_ & 0xffffffffffffff00;
      local_358 = 0;
      local_350._M_local_buf[0] = '\0';
      local_340 = 0;
      peVar2 = (local_338->
               super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      local_380 = local_370;
      local_370._16_8_ = &local_350;
      (*(peVar2->super_CommissionerHandler)._vptr_CommissionerHandler[0x3c])
                (local_78,peVar2,local_3a0,0xffff);
      local_3e8._0_4_ = local_78[0];
      _Stack_3e0._M_p = local_3d8 + 8;
      std::__cxx11::string::_M_construct<char*>((string *)&_Stack_3e0,local_70,local_70 + local_68);
      local_3b8 = 0;
      local_3b0._M_local_buf[0] = '\0';
      (__return_storage_ptr__->mError).mCode = local_3e8._0_4_;
      local_3c0._M_p = (pointer)&local_3b0;
      std::__cxx11::string::operator=(local_330,(string *)&_Stack_3e0);
      std::__cxx11::string::operator=(local_328,(string *)&local_3c0);
      EVar1 = (__return_storage_ptr__->mError).mCode;
      aDataset = extraout_RDX;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3c0._M_p != &local_3b0) {
        operator_delete(local_3c0._M_p);
        aDataset = extraout_RDX_00;
      }
      if (_Stack_3e0._M_p != local_3d8 + 8) {
        operator_delete(_Stack_3e0._M_p);
        aDataset = extraout_RDX_01;
      }
      if (local_70 != local_60) {
        operator_delete(local_70);
        aDataset = extraout_RDX_02;
      }
      if (EVar1 == kNone) {
        BbrDatasetToJson_abi_cxx11_(&local_50,(commissioner *)local_3a0,aDataset);
        Value::Value((Value *)local_3e8,&local_50);
        (__return_storage_ptr__->mError).mCode = local_3e8._0_4_;
        std::__cxx11::string::operator=(local_330,(string *)&_Stack_3e0);
        std::__cxx11::string::operator=(local_328,(string *)&local_3c0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3c0._M_p != &local_3b0) {
          operator_delete(local_3c0._M_p);
        }
        if (_Stack_3e0._M_p != local_3d8 + 8) {
          operator_delete(_Stack_3e0._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_370._16_8_ != &local_350) {
        operator_delete((void *)local_370._16_8_);
      }
      if ((undefined1 *)local_380 != local_370) {
        operator_delete((void *)local_380);
      }
      paVar7 = &local_390;
      _Var13._M_p = (pointer)local_3a0;
      goto LAB_001c5bda;
    }
LAB_001c5cc4:
    if (0x40 < uVar6) {
      local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_408,"trihostname","");
      utils::ToLower((string *)local_3a0,pbVar14 + 2);
      utils::ToLower((string *)local_3e8,&local_408);
      auVar4 = local_3e8;
      cVar3 = (char)uVar15;
      if (local_398._M_p == _Stack_3e0._M_p) {
        if (local_398._M_p == (char *)0x0) {
          bVar18 = true;
        }
        else {
          iVar5 = bcmp((void *)local_3a0,(void *)local_3e8,(size_t)local_398._M_p);
          bVar18 = iVar5 == 0;
        }
      }
      else {
        bVar18 = false;
      }
      if (auVar4 != (undefined1  [8])local_3d8) {
        operator_delete((void *)auVar4);
      }
      if (local_3a0 != (undefined1  [8])&local_390) {
        operator_delete((void *)local_3a0);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_408._M_dataplus._M_p != &local_408.field_2) {
        operator_delete(local_408._M_dataplus._M_p);
      }
      if (bVar18) {
        _Stack_3e0._M_p = (char *)0x0;
        local_3d8._0_8_ = local_3d8._0_8_ & 0xffffffffffffff00;
        if (cVar3 == '\0') {
          pbVar14 = (aExpr->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          if ((ulong)((long)(aExpr->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar14) < 0x61) {
            local_3e8 = (undefined1  [8])local_3d8;
            ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
            args_02.field_1.args_ = in_R9.args_;
            args_02.desc_ = (unsigned_long_long)local_318;
            ::fmt::v10::vformat_abi_cxx11_
                      (&local_408,(v10 *)"too few arguments",(string_view)ZEXT816(0x11),args_02);
            local_290 = 2;
            local_288 = local_278;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_288,local_408._M_dataplus._M_p,
                       local_408._M_dataplus._M_p + local_408._M_string_length);
            local_3a0._0_4_ = local_290;
            local_398._M_p = local_390._M_local_buf + 8;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_398,local_288,local_288 + local_280);
            local_378._M_p = local_370 + 8;
            local_370._0_8_ = 0;
            local_370[8] = '\0';
            Value::operator=(__return_storage_ptr__,(Value *)local_3a0);
            Value::~Value((Value *)local_3a0);
            if (local_288 != local_278) {
              operator_delete(local_288);
            }
            _Var13._M_p = local_408._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_408._M_dataplus._M_p != &local_408.field_2) goto LAB_001c6a98;
          }
          else {
            peVar2 = (local_338->
                     super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>
                     )._M_ptr;
            local_3e8 = (undefined1  [8])local_3d8;
            (*(peVar2->super_CommissionerHandler)._vptr_CommissionerHandler[0x38])
                      (local_a0,peVar2,pbVar14 + 3);
            local_3a0._0_4_ = local_a0[0];
            local_398._M_p = local_390._M_local_buf + 8;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_398,local_98,local_90 + local_98);
            local_378._M_p = local_370 + 8;
            local_370._0_8_ = 0;
            local_370[8] = '\0';
            Value::operator=(__return_storage_ptr__,(Value *)local_3a0);
            Value::~Value((Value *)local_3a0);
            pcVar10 = local_88;
LAB_001c6676:
            _Var13._M_p = (pointer)*(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     **)(pcVar10 + -0x10);
            if (*(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  **)(pcVar10 + -0x10) !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)pcVar10) {
LAB_001c6a98:
              operator_delete(_Var13._M_p);
            }
          }
        }
        else {
          peVar2 = (local_338->
                   super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>
                   )._M_ptr;
          local_3e8 = (undefined1  [8])local_3d8;
          (*(peVar2->super_CommissionerHandler)._vptr_CommissionerHandler[0x37])
                    (local_c8,peVar2,local_3e8);
          local_3a0._0_4_ = local_c8[0];
          local_398._M_p = local_390._M_local_buf + 8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_398,local_c0,local_c0 + local_b8);
          local_370._0_8_ = 0;
          local_370[8] = '\0';
          (__return_storage_ptr__->mError).mCode = local_3a0._0_4_;
          local_378._M_p = local_370 + 8;
          std::__cxx11::string::operator=(local_330,(string *)&local_398);
          std::__cxx11::string::operator=(local_328,(string *)&local_378);
          EVar1 = (__return_storage_ptr__->mError).mCode;
          if (local_378._M_p != local_370 + 8) {
            operator_delete(local_378._M_p);
          }
          if (local_398._M_p != local_390._M_local_buf + 8) {
            operator_delete(local_398._M_p);
          }
          if (local_c0 != local_b0) {
            operator_delete(local_c0);
          }
          if (EVar1 == kNone) {
            local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_1b0,local_3e8,_Stack_3e0._M_p + (long)local_3e8);
            Value::Value((Value *)local_3a0,&local_1b0);
            Value::operator=(__return_storage_ptr__,(Value *)local_3a0);
            Value::~Value((Value *)local_3a0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
              operator_delete(local_1b0._M_dataplus._M_p);
            }
          }
        }
      }
      else {
        pbVar14 = (aExpr->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_408,"reghostname","");
        utils::ToLower((string *)local_3a0,pbVar14 + 2);
        utils::ToLower((string *)local_3e8,&local_408);
        auVar4 = local_3e8;
        if (local_398._M_p == _Stack_3e0._M_p) {
          if (local_398._M_p == (char *)0x0) {
            bVar18 = true;
          }
          else {
            iVar5 = bcmp((void *)local_3a0,(void *)local_3e8,(size_t)local_398._M_p);
            bVar18 = iVar5 == 0;
          }
        }
        else {
          bVar18 = false;
        }
        if (auVar4 != (undefined1  [8])local_3d8) {
          operator_delete((void *)auVar4);
        }
        if (local_3a0 != (undefined1  [8])&local_390) {
          operator_delete((void *)local_3a0);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_408._M_dataplus._M_p != &local_408.field_2) {
          operator_delete(local_408._M_dataplus._M_p);
        }
        if (bVar18) {
          _Stack_3e0._M_p = (char *)0x0;
          local_3d8._0_8_ = local_3d8._0_8_ & 0xffffffffffffff00;
          if (cVar3 == '\0') {
            pbVar14 = (aExpr->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            if (0x60 < (ulong)((long)(aExpr->
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar14)) {
              peVar2 = (local_338->
                       super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>
                       )._M_ptr;
              local_3e8 = (undefined1  [8])local_3d8;
              (*(peVar2->super_CommissionerHandler)._vptr_CommissionerHandler[0x3a])
                        (local_f0,peVar2,pbVar14 + 3);
              local_3a0._0_4_ = local_f0[0];
              local_398._M_p = local_390._M_local_buf + 8;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_398,local_e8,local_e0 + local_e8);
              local_378._M_p = local_370 + 8;
              local_370._0_8_ = 0;
              local_370[8] = '\0';
              Value::operator=(__return_storage_ptr__,(Value *)local_3a0);
              Value::~Value((Value *)local_3a0);
              pcVar10 = local_d8;
              goto LAB_001c6676;
            }
            local_3e8 = (undefined1  [8])local_3d8;
            ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
            args_03.field_1.args_ = in_R9.args_;
            args_03.desc_ = (unsigned_long_long)local_318;
            ::fmt::v10::vformat_abi_cxx11_
                      (&local_408,(v10 *)"too few arguments",(string_view)ZEXT816(0x11),args_03);
            local_2b8 = 2;
            local_2b0 = local_2a0;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_2b0,local_408._M_dataplus._M_p,
                       local_408._M_dataplus._M_p + local_408._M_string_length);
            local_3a0._0_4_ = local_2b8;
            local_398._M_p = local_390._M_local_buf + 8;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_398,local_2b0,local_2b0 + local_2a8);
            local_378._M_p = local_370 + 8;
            local_370._0_8_ = 0;
            local_370[8] = '\0';
            Value::operator=(__return_storage_ptr__,(Value *)local_3a0);
            Value::~Value((Value *)local_3a0);
            if (local_2b0 != local_2a0) {
              operator_delete(local_2b0);
            }
            bVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)local_408._M_dataplus._M_p == &local_408.field_2;
LAB_001c6a93:
            _Var13._M_p = local_408._M_dataplus._M_p;
            if (!bVar18) goto LAB_001c6a98;
          }
          else {
            peVar2 = (local_338->
                     super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>
                     )._M_ptr;
            local_3e8 = (undefined1  [8])local_3d8;
            (*(peVar2->super_CommissionerHandler)._vptr_CommissionerHandler[0x39])
                      (local_118,peVar2,local_3e8);
            local_3a0._0_4_ = local_118[0];
            local_398._M_p = local_390._M_local_buf + 8;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_398,local_110,local_110 + local_108);
            local_378._M_p = local_370 + 8;
            local_370._0_8_ = 0;
            local_370[8] = '\0';
            pVVar9 = Value::operator=(__return_storage_ptr__,(Value *)local_3a0);
            EVar1 = (pVVar9->mError).mCode;
            Value::~Value((Value *)local_3a0);
            if (local_110 != local_100) {
              operator_delete(local_110);
            }
            if (EVar1 == kNone) {
              paVar7 = &local_1d0.field_2;
              local_1d0._M_dataplus._M_p = (pointer)paVar7;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_1d0,local_3e8,_Stack_3e0._M_p + (long)local_3e8);
              Value::Value((Value *)local_3a0,&local_1d0);
              Value::operator=(__return_storage_ptr__,(Value *)local_3a0);
              Value::~Value((Value *)local_3a0);
              _Var13._M_p = local_1d0._M_dataplus._M_p;
LAB_001c68c0:
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)_Var13._M_p != paVar7) {
                operator_delete(_Var13._M_p);
              }
            }
          }
        }
        else {
          pbVar14 = (aExpr->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_408,"regaddr","");
          utils::ToLower((string *)local_3a0,pbVar14 + 2);
          utils::ToLower((string *)local_3e8,&local_408);
          auVar4 = local_3e8;
          if (local_398._M_p == _Stack_3e0._M_p) {
            if (local_398._M_p == (char *)0x0) {
              bVar18 = true;
            }
            else {
              iVar5 = bcmp((void *)local_3a0,(void *)local_3e8,(size_t)local_398._M_p);
              bVar18 = iVar5 == 0;
            }
          }
          else {
            bVar18 = false;
          }
          if (auVar4 != (undefined1  [8])local_3d8) {
            operator_delete((void *)auVar4);
          }
          if (local_3a0 != (undefined1  [8])&local_390) {
            operator_delete((void *)local_3a0);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_408._M_dataplus._M_p != &local_408.field_2) {
            operator_delete(local_408._M_dataplus._M_p);
          }
          if (!bVar18) {
            if (cVar3 == '\0') {
              local_380 = local_370;
              local_3a0 = (undefined1  [8])&local_390;
              local_398._M_p = (pointer)0x0;
              local_390._M_local_buf[0] = '\0';
              local_378._M_p = (pointer)0x0;
              local_370._0_8_ = local_370._0_8_ & 0xffffffffffffff00;
              local_370._16_8_ = &local_350;
              local_358 = 0;
              local_350._M_local_buf[0] = '\0';
              local_340 = 0;
              BbrDatasetFromJson(&local_168,(BbrDataset *)local_3a0,
                                 (aExpr->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start + 2);
              local_3e8._0_4_ = local_168.mCode;
              _Stack_3e0._M_p = local_3d8 + 8;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&_Stack_3e0,local_168.mMessage._M_dataplus._M_p,
                         local_168.mMessage._M_dataplus._M_p + local_168.mMessage._M_string_length);
              local_3b8 = 0;
              local_3b0._M_local_buf[0] = '\0';
              local_3c0._M_p = (pointer)&local_3b0;
              pVVar9 = Value::operator=(__return_storage_ptr__,(Value *)local_3e8);
              EVar1 = (pVVar9->mError).mCode;
              Value::~Value((Value *)local_3e8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_168.mMessage._M_dataplus._M_p != &local_168.mMessage.field_2) {
                operator_delete(local_168.mMessage._M_dataplus._M_p);
              }
              if (EVar1 == kNone) {
                peVar2 = (local_338->
                         super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>
                         )._M_ptr;
                (*(peVar2->super_CommissionerHandler)._vptr_CommissionerHandler[0x3d])
                          (local_190,peVar2,local_3a0);
                local_3e8._0_4_ = local_190[0][0];
                _Stack_3e0._M_p = local_3d8 + 8;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&_Stack_3e0,local_188,local_188 + local_180);
                local_3b8 = 0;
                local_3b0._M_local_buf[0] = '\0';
                local_3c0._M_p = (pointer)&local_3b0;
                Value::operator=(__return_storage_ptr__,(Value *)local_3e8);
                Value::~Value((Value *)local_3e8);
                if (local_188 != local_178) {
                  operator_delete(local_188);
                }
              }
              BbrDataset::~BbrDataset((BbrDataset *)local_3a0);
              return __return_storage_ptr__;
            }
            ::fmt::v10::detail::
            check_format_string<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_FMT_COMPILE_STRING,_0>
                      ();
            pbVar14 = (aExpr->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            local_408._M_dataplus._M_p = pbVar14[2]._M_dataplus._M_p;
            local_408._M_string_length = pbVar14[2]._M_string_length;
            fmt_00.size_ = 0xd;
            fmt_00.data_ = (char *)0x23;
            args_04.field_1.values_ = in_R9.values_;
            args_04.desc_ = (unsigned_long_long)&local_408;
            ::fmt::v10::vformat_abi_cxx11_
                      ((string *)local_3e8,(v10 *)"{} is not a valid BBR Dataset field",fmt_00,
                       args_04);
            local_308 = 2;
            local_300 = local_2f0;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_300,local_3e8,_Stack_3e0._M_p + (long)local_3e8);
            local_3a0._0_4_ = local_308;
            local_398._M_p = local_390._M_local_buf + 8;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_398,local_300,local_300 + local_2f8);
            local_378._M_p = local_370 + 8;
            local_370._0_8_ = 0;
            local_370[8] = '\0';
            Value::operator=(__return_storage_ptr__,(Value *)local_3a0);
            Value::~Value((Value *)local_3a0);
            if (local_300 != local_2f0) {
              operator_delete(local_300);
            }
            _Var13._M_p = (pointer)local_3e8;
            if (local_3e8 == (undefined1  [8])local_3d8) {
              return __return_storage_ptr__;
            }
            goto LAB_001c6aa7;
          }
          _Stack_3e0._M_p = (char *)0x0;
          local_3d8._0_8_ = local_3d8._0_8_ & 0xffffffffffffff00;
          if (cVar3 == '\0') {
            local_3e8 = (undefined1  [8])local_3d8;
            ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
            args_05.field_1.values_ = in_R9.values_;
            args_05.desc_ = (unsigned_long_long)local_318;
            ::fmt::v10::vformat_abi_cxx11_
                      (&local_408,(v10 *)"cannot set  read-only Registrar Address",
                       (string_view)ZEXT816(0x27),args_05);
            local_2e0 = 2;
            local_2d8 = local_2c8;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_2d8,local_408._M_dataplus._M_p,
                       local_408._M_dataplus._M_p + local_408._M_string_length);
            local_3a0._0_4_ = local_2e0;
            local_398._M_p = local_390._M_local_buf + 8;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_398,local_2d8,local_2d8 + local_2d0);
            local_378._M_p = local_370 + 8;
            local_370._0_8_ = 0;
            local_370[8] = '\0';
            Value::operator=(__return_storage_ptr__,(Value *)local_3a0);
            Value::~Value((Value *)local_3a0);
            if (local_2d8 != local_2c8) {
              operator_delete(local_2d8);
            }
            bVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)local_408._M_dataplus._M_p == &local_408.field_2;
            goto LAB_001c6a93;
          }
          peVar2 = (local_338->
                   super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>
                   )._M_ptr;
          local_3e8 = (undefined1  [8])local_3d8;
          (*(peVar2->super_CommissionerHandler)._vptr_CommissionerHandler[0x3b])
                    (local_140,peVar2,local_3e8);
          local_3a0._0_4_ = local_140[0];
          local_398._M_p = local_390._M_local_buf + 8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_398,local_138,local_138 + local_130);
          local_378._M_p = local_370 + 8;
          local_370._0_8_ = 0;
          local_370[8] = '\0';
          pVVar9 = Value::operator=(__return_storage_ptr__,(Value *)local_3a0);
          EVar1 = (pVVar9->mError).mCode;
          Value::~Value((Value *)local_3a0);
          if (local_138 != local_128) {
            operator_delete(local_138);
          }
          if (EVar1 == kNone) {
            paVar7 = &local_1f0.field_2;
            local_1f0._M_dataplus._M_p = (pointer)paVar7;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_1f0,local_3e8,_Stack_3e0._M_p + (long)local_3e8);
            Value::Value((Value *)local_3a0,&local_1f0);
            Value::operator=(__return_storage_ptr__,(Value *)local_3a0);
            Value::~Value((Value *)local_3a0);
            _Var13._M_p = local_1f0._M_dataplus._M_p;
            goto LAB_001c68c0;
          }
        }
      }
      _Var13._M_p = (pointer)local_3e8;
      if (local_3e8 == (undefined1  [8])local_3d8) {
        return __return_storage_ptr__;
      }
      goto LAB_001c6aa7;
    }
    local_3e8 = (undefined1  [8])((ulong)local_3e8 & 0xffffffff00000000);
    _Stack_3e0._M_p = "too few arguments";
    local_3d8._0_8_ = 0x11;
    local_3d8._8_8_ = 0;
    local_3c0._M_p = (pointer)0x0;
    pcVar11 = "too few arguments";
    local_3d8._16_8_ = (format_string_checker<char> *)local_3e8;
    do {
      pcVar8 = pcVar11 + 1;
      if (*pcVar11 == '}') {
        if ((pcVar8 == "") || (*pcVar8 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar8 = pcVar11 + 2;
      }
      else if (*pcVar11 == '{') {
        pcVar8 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (pcVar11,"",(format_string_checker<char> *)local_3e8);
      }
      pcVar11 = pcVar8;
    } while (pcVar8 != "");
    args_00.field_1.args_ = in_R9.args_;
    args_00.desc_ = (unsigned_long_long)local_3e8;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_408,(v10 *)"too few arguments",(string_view)ZEXT816(0x11),args_00);
    local_268 = 2;
    puVar17 = local_250;
    local_260 = puVar17;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_260,local_408._M_dataplus._M_p,
               local_408._M_dataplus._M_p + local_408._M_string_length);
    local_3a0._0_4_ = local_268;
    local_398._M_p = local_390._M_local_buf + 8;
    std::__cxx11::string::_M_construct<char*>((string *)&local_398,local_260,local_260 + local_258);
    local_370._0_8_ = 0;
    local_370[8] = '\0';
    (__return_storage_ptr__->mError).mCode = local_3a0._0_4_;
    local_378._M_p = local_370 + 8;
    std::__cxx11::string::operator=(local_330,(string *)&local_398);
    std::__cxx11::string::operator=(local_328,(string *)&local_378);
    if (local_378._M_p != local_370 + 8) {
      operator_delete(local_378._M_p);
    }
    puVar12 = local_260;
    if (local_398._M_p != local_390._M_local_buf + 8) {
      operator_delete(local_398._M_p);
      puVar12 = local_260;
    }
  }
  if (puVar12 != puVar17) {
    operator_delete(puVar12);
  }
  _Var13._M_p = local_408._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_408._M_dataplus._M_p == &local_408.field_2) {
    return __return_storage_ptr__;
  }
LAB_001c6aa7:
  operator_delete(_Var13._M_p);
  return __return_storage_ptr__;
}

Assistant:

Interpreter::Value Interpreter::ProcessBbrDatasetJob(CommissionerAppPtr &aCommissioner, const Expression &aExpr)
{
    Value value;
    bool  isSet;

    VerifyOrExit(aExpr.size() >= 2, value = ERROR_INVALID_ARGS(SYNTAX_FEW_ARGS));
    if (CaseInsensitiveEqual(aExpr[1], "get"))
    {
        isSet = false;
    }
    else if (CaseInsensitiveEqual(aExpr[1], "set"))
    {
        isSet = true;
    }
    else
    {
        ExitNow(value = ERROR_INVALID_COMMAND(SYNTAX_INVALID_SUBCOMMAND, aExpr[1]));
    }

    if (aExpr.size() == 2 && !isSet)
    {
        BbrDataset dataset;
        SuccessOrExit(value = aCommissioner->GetBbrDataset(dataset, 0xFFFF));
        ExitNow(value = BbrDatasetToJson(dataset));
    }

    VerifyOrExit(aExpr.size() >= 3, value = ERROR_INVALID_ARGS(SYNTAX_FEW_ARGS));

    if (CaseInsensitiveEqual(aExpr[2], "trihostname"))
    {
        std::string triHostname;
        if (isSet)
        {
            VerifyOrExit(aExpr.size() >= 4, value = ERROR_INVALID_ARGS(SYNTAX_FEW_ARGS));
            SuccessOrExit(value = aCommissioner->SetTriHostname(aExpr[3]));
        }
        else
        {
            SuccessOrExit(value = aCommissioner->GetTriHostname(triHostname));
            value = triHostname;
        }
    }
    else if (CaseInsensitiveEqual(aExpr[2], "reghostname"))
    {
        std::string regHostname;
        if (isSet)
        {
            VerifyOrExit(aExpr.size() >= 4, value = ERROR_INVALID_ARGS(SYNTAX_FEW_ARGS));
            SuccessOrExit(value = aCommissioner->SetRegistrarHostname(aExpr[3]));
        }
        else
        {
            SuccessOrExit(value = aCommissioner->GetRegistrarHostname(regHostname));
            value = regHostname;
        }
    }
    else if (CaseInsensitiveEqual(aExpr[2], "regaddr"))
    {
        std::string regAddr;
        VerifyOrExit(!isSet, value = ERROR_INVALID_ARGS("cannot set  read-only Registrar Address"));
        SuccessOrExit(value = aCommissioner->GetRegistrarIpv6Addr(regAddr));
        value = regAddr;
    }
    else
    {
        if (isSet)
        {
            BbrDataset dataset;
            SuccessOrExit(value = BbrDatasetFromJson(dataset, aExpr[2]));
            SuccessOrExit(value = aCommissioner->SetBbrDataset(dataset));
        }
        else
        {
            value = ERROR_INVALID_ARGS("{} is not a valid BBR Dataset field", aExpr[2]);
        }
    }

exit:
    return value;
}